

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O2

void print_bool(string *path,bool value)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)path);
  poVar1 = std::operator<<(poVar1,": bool: ");
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
print_bool(std::string const& path, bool value)
{
    std::cout << path << ": bool: " << (value ? "true" : "false") << std::endl;
}